

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

char * get_key_name(int key)

{
  char *pcStack_10;
  int key_local;
  
  switch(key) {
  case 0x20:
    pcStack_10 = "SPACE";
    break;
  default:
    pcStack_10 = "UNKNOWN";
    break;
  case 0x27:
    pcStack_10 = "APOSTROPHE";
    break;
  case 0x2c:
    pcStack_10 = "COMMA";
    break;
  case 0x2d:
    pcStack_10 = "MINUS";
    break;
  case 0x2e:
    pcStack_10 = "PERIOD";
    break;
  case 0x2f:
    pcStack_10 = "SLASH";
    break;
  case 0x30:
    pcStack_10 = "0";
    break;
  case 0x31:
    pcStack_10 = "1";
    break;
  case 0x32:
    pcStack_10 = "2";
    break;
  case 0x33:
    pcStack_10 = "3";
    break;
  case 0x34:
    pcStack_10 = "4";
    break;
  case 0x35:
    pcStack_10 = "5";
    break;
  case 0x36:
    pcStack_10 = "6";
    break;
  case 0x37:
    pcStack_10 = "7";
    break;
  case 0x38:
    pcStack_10 = "8";
    break;
  case 0x39:
    pcStack_10 = "9";
    break;
  case 0x3b:
    pcStack_10 = "SEMICOLON";
    break;
  case 0x3d:
    pcStack_10 = "EQUAL";
    break;
  case 0x41:
    pcStack_10 = "A";
    break;
  case 0x42:
    pcStack_10 = "B";
    break;
  case 0x43:
    pcStack_10 = "C";
    break;
  case 0x44:
    pcStack_10 = "D";
    break;
  case 0x45:
    pcStack_10 = "E";
    break;
  case 0x46:
    pcStack_10 = "F";
    break;
  case 0x47:
    pcStack_10 = "G";
    break;
  case 0x48:
    pcStack_10 = "H";
    break;
  case 0x49:
    pcStack_10 = "I";
    break;
  case 0x4a:
    pcStack_10 = "J";
    break;
  case 0x4b:
    pcStack_10 = "K";
    break;
  case 0x4c:
    pcStack_10 = "L";
    break;
  case 0x4d:
    pcStack_10 = "M";
    break;
  case 0x4e:
    pcStack_10 = "N";
    break;
  case 0x4f:
    pcStack_10 = "O";
    break;
  case 0x50:
    pcStack_10 = "P";
    break;
  case 0x51:
    pcStack_10 = "Q";
    break;
  case 0x52:
    pcStack_10 = "R";
    break;
  case 0x53:
    pcStack_10 = "S";
    break;
  case 0x54:
    pcStack_10 = "T";
    break;
  case 0x55:
    pcStack_10 = "U";
    break;
  case 0x56:
    pcStack_10 = "V";
    break;
  case 0x57:
    pcStack_10 = "W";
    break;
  case 0x58:
    pcStack_10 = "X";
    break;
  case 0x59:
    pcStack_10 = "Y";
    break;
  case 0x5a:
    pcStack_10 = "Z";
    break;
  case 0x5b:
    pcStack_10 = "LEFT BRACKET";
    break;
  case 0x5c:
    pcStack_10 = "BACKSLASH";
    break;
  case 0x5d:
    pcStack_10 = "RIGHT BRACKET";
    break;
  case 0x60:
    pcStack_10 = "GRAVE ACCENT";
    break;
  case 0xa1:
    pcStack_10 = "WORLD 1";
    break;
  case 0xa2:
    pcStack_10 = "WORLD 2";
    break;
  case 0x100:
    pcStack_10 = "ESCAPE";
    break;
  case 0x101:
    pcStack_10 = "ENTER";
    break;
  case 0x102:
    pcStack_10 = "TAB";
    break;
  case 0x103:
    pcStack_10 = "BACKSPACE";
    break;
  case 0x104:
    pcStack_10 = "INSERT";
    break;
  case 0x105:
    pcStack_10 = "DELETE";
    break;
  case 0x106:
    pcStack_10 = "RIGHT";
    break;
  case 0x107:
    pcStack_10 = "LEFT";
    break;
  case 0x108:
    pcStack_10 = "DOWN";
    break;
  case 0x109:
    pcStack_10 = "UP";
    break;
  case 0x10a:
    pcStack_10 = "PAGE UP";
    break;
  case 0x10b:
    pcStack_10 = "PAGE DOWN";
    break;
  case 0x10c:
    pcStack_10 = "HOME";
    break;
  case 0x10d:
    pcStack_10 = "END";
    break;
  case 0x118:
    pcStack_10 = "CAPS LOCK";
    break;
  case 0x119:
    pcStack_10 = "SCROLL LOCK";
    break;
  case 0x11a:
    pcStack_10 = "NUM LOCK";
    break;
  case 0x11b:
    pcStack_10 = "PRINT SCREEN";
    break;
  case 0x11c:
    pcStack_10 = "PAUSE";
    break;
  case 0x122:
    pcStack_10 = "F1";
    break;
  case 0x123:
    pcStack_10 = "F2";
    break;
  case 0x124:
    pcStack_10 = "F3";
    break;
  case 0x125:
    pcStack_10 = "F4";
    break;
  case 0x126:
    pcStack_10 = "F5";
    break;
  case 0x127:
    pcStack_10 = "F6";
    break;
  case 0x128:
    pcStack_10 = "F7";
    break;
  case 0x129:
    pcStack_10 = "F8";
    break;
  case 0x12a:
    pcStack_10 = "F9";
    break;
  case 299:
    pcStack_10 = "F10";
    break;
  case 300:
    pcStack_10 = "F11";
    break;
  case 0x12d:
    pcStack_10 = "F12";
    break;
  case 0x12e:
    pcStack_10 = "F13";
    break;
  case 0x12f:
    pcStack_10 = "F14";
    break;
  case 0x130:
    pcStack_10 = "F15";
    break;
  case 0x131:
    pcStack_10 = "F16";
    break;
  case 0x132:
    pcStack_10 = "F17";
    break;
  case 0x133:
    pcStack_10 = "F18";
    break;
  case 0x134:
    pcStack_10 = "F19";
    break;
  case 0x135:
    pcStack_10 = "F20";
    break;
  case 0x136:
    pcStack_10 = "F21";
    break;
  case 0x137:
    pcStack_10 = "F22";
    break;
  case 0x138:
    pcStack_10 = "F23";
    break;
  case 0x139:
    pcStack_10 = "F24";
    break;
  case 0x13a:
    pcStack_10 = "F25";
    break;
  case 0x140:
    pcStack_10 = "KEYPAD 0";
    break;
  case 0x141:
    pcStack_10 = "KEYPAD 1";
    break;
  case 0x142:
    pcStack_10 = "KEYPAD 2";
    break;
  case 0x143:
    pcStack_10 = "KEYPAD 3";
    break;
  case 0x144:
    pcStack_10 = "KEYPAD 4";
    break;
  case 0x145:
    pcStack_10 = "KEYPAD 5";
    break;
  case 0x146:
    pcStack_10 = "KEYPAD 6";
    break;
  case 0x147:
    pcStack_10 = "KEYPAD 7";
    break;
  case 0x148:
    pcStack_10 = "KEYPAD 8";
    break;
  case 0x149:
    pcStack_10 = "KEYPAD 9";
    break;
  case 0x14a:
    pcStack_10 = "KEYPAD DECIMAL";
    break;
  case 0x14b:
    pcStack_10 = "KEYPAD DIVIDE";
    break;
  case 0x14c:
    pcStack_10 = "KEYPAD MULTPLY";
    break;
  case 0x14d:
    pcStack_10 = "KEYPAD SUBTRACT";
    break;
  case 0x14e:
    pcStack_10 = "KEYPAD ADD";
    break;
  case 0x14f:
    pcStack_10 = "KEYPAD ENTER";
    break;
  case 0x150:
    pcStack_10 = "KEYPAD EQUAL";
    break;
  case 0x154:
    pcStack_10 = "LEFT SHIFT";
    break;
  case 0x155:
    pcStack_10 = "LEFT CONTROL";
    break;
  case 0x156:
    pcStack_10 = "LEFT ALT";
    break;
  case 0x157:
    pcStack_10 = "LEFT SUPER";
    break;
  case 0x158:
    pcStack_10 = "RIGHT SHIFT";
    break;
  case 0x159:
    pcStack_10 = "RIGHT CONTROL";
    break;
  case 0x15a:
    pcStack_10 = "RIGHT ALT";
    break;
  case 0x15b:
    pcStack_10 = "RIGHT SUPER";
    break;
  case 0x15c:
    pcStack_10 = "MENU";
  }
  return pcStack_10;
}

Assistant:

static const char* get_key_name(int key)
{
    switch (key)
    {
        // Printable keys
        case GLFW_KEY_A:            return "A";
        case GLFW_KEY_B:            return "B";
        case GLFW_KEY_C:            return "C";
        case GLFW_KEY_D:            return "D";
        case GLFW_KEY_E:            return "E";
        case GLFW_KEY_F:            return "F";
        case GLFW_KEY_G:            return "G";
        case GLFW_KEY_H:            return "H";
        case GLFW_KEY_I:            return "I";
        case GLFW_KEY_J:            return "J";
        case GLFW_KEY_K:            return "K";
        case GLFW_KEY_L:            return "L";
        case GLFW_KEY_M:            return "M";
        case GLFW_KEY_N:            return "N";
        case GLFW_KEY_O:            return "O";
        case GLFW_KEY_P:            return "P";
        case GLFW_KEY_Q:            return "Q";
        case GLFW_KEY_R:            return "R";
        case GLFW_KEY_S:            return "S";
        case GLFW_KEY_T:            return "T";
        case GLFW_KEY_U:            return "U";
        case GLFW_KEY_V:            return "V";
        case GLFW_KEY_W:            return "W";
        case GLFW_KEY_X:            return "X";
        case GLFW_KEY_Y:            return "Y";
        case GLFW_KEY_Z:            return "Z";
        case GLFW_KEY_1:            return "1";
        case GLFW_KEY_2:            return "2";
        case GLFW_KEY_3:            return "3";
        case GLFW_KEY_4:            return "4";
        case GLFW_KEY_5:            return "5";
        case GLFW_KEY_6:            return "6";
        case GLFW_KEY_7:            return "7";
        case GLFW_KEY_8:            return "8";
        case GLFW_KEY_9:            return "9";
        case GLFW_KEY_0:            return "0";
        case GLFW_KEY_SPACE:        return "SPACE";
        case GLFW_KEY_MINUS:        return "MINUS";
        case GLFW_KEY_EQUAL:        return "EQUAL";
        case GLFW_KEY_LEFT_BRACKET: return "LEFT BRACKET";
        case GLFW_KEY_RIGHT_BRACKET: return "RIGHT BRACKET";
        case GLFW_KEY_BACKSLASH:    return "BACKSLASH";
        case GLFW_KEY_SEMICOLON:    return "SEMICOLON";
        case GLFW_KEY_APOSTROPHE:   return "APOSTROPHE";
        case GLFW_KEY_GRAVE_ACCENT: return "GRAVE ACCENT";
        case GLFW_KEY_COMMA:        return "COMMA";
        case GLFW_KEY_PERIOD:       return "PERIOD";
        case GLFW_KEY_SLASH:        return "SLASH";
        case GLFW_KEY_WORLD_1:      return "WORLD 1";
        case GLFW_KEY_WORLD_2:      return "WORLD 2";

        // Function keys
        case GLFW_KEY_ESCAPE:       return "ESCAPE";
        case GLFW_KEY_F1:           return "F1";
        case GLFW_KEY_F2:           return "F2";
        case GLFW_KEY_F3:           return "F3";
        case GLFW_KEY_F4:           return "F4";
        case GLFW_KEY_F5:           return "F5";
        case GLFW_KEY_F6:           return "F6";
        case GLFW_KEY_F7:           return "F7";
        case GLFW_KEY_F8:           return "F8";
        case GLFW_KEY_F9:           return "F9";
        case GLFW_KEY_F10:          return "F10";
        case GLFW_KEY_F11:          return "F11";
        case GLFW_KEY_F12:          return "F12";
        case GLFW_KEY_F13:          return "F13";
        case GLFW_KEY_F14:          return "F14";
        case GLFW_KEY_F15:          return "F15";
        case GLFW_KEY_F16:          return "F16";
        case GLFW_KEY_F17:          return "F17";
        case GLFW_KEY_F18:          return "F18";
        case GLFW_KEY_F19:          return "F19";
        case GLFW_KEY_F20:          return "F20";
        case GLFW_KEY_F21:          return "F21";
        case GLFW_KEY_F22:          return "F22";
        case GLFW_KEY_F23:          return "F23";
        case GLFW_KEY_F24:          return "F24";
        case GLFW_KEY_F25:          return "F25";
        case GLFW_KEY_UP:           return "UP";
        case GLFW_KEY_DOWN:         return "DOWN";
        case GLFW_KEY_LEFT:         return "LEFT";
        case GLFW_KEY_RIGHT:        return "RIGHT";
        case GLFW_KEY_LEFT_SHIFT:   return "LEFT SHIFT";
        case GLFW_KEY_RIGHT_SHIFT:  return "RIGHT SHIFT";
        case GLFW_KEY_LEFT_CONTROL: return "LEFT CONTROL";
        case GLFW_KEY_RIGHT_CONTROL: return "RIGHT CONTROL";
        case GLFW_KEY_LEFT_ALT:     return "LEFT ALT";
        case GLFW_KEY_RIGHT_ALT:    return "RIGHT ALT";
        case GLFW_KEY_TAB:          return "TAB";
        case GLFW_KEY_ENTER:        return "ENTER";
        case GLFW_KEY_BACKSPACE:    return "BACKSPACE";
        case GLFW_KEY_INSERT:       return "INSERT";
        case GLFW_KEY_DELETE:       return "DELETE";
        case GLFW_KEY_PAGE_UP:      return "PAGE UP";
        case GLFW_KEY_PAGE_DOWN:    return "PAGE DOWN";
        case GLFW_KEY_HOME:         return "HOME";
        case GLFW_KEY_END:          return "END";
        case GLFW_KEY_KP_0:         return "KEYPAD 0";
        case GLFW_KEY_KP_1:         return "KEYPAD 1";
        case GLFW_KEY_KP_2:         return "KEYPAD 2";
        case GLFW_KEY_KP_3:         return "KEYPAD 3";
        case GLFW_KEY_KP_4:         return "KEYPAD 4";
        case GLFW_KEY_KP_5:         return "KEYPAD 5";
        case GLFW_KEY_KP_6:         return "KEYPAD 6";
        case GLFW_KEY_KP_7:         return "KEYPAD 7";
        case GLFW_KEY_KP_8:         return "KEYPAD 8";
        case GLFW_KEY_KP_9:         return "KEYPAD 9";
        case GLFW_KEY_KP_DIVIDE:    return "KEYPAD DIVIDE";
        case GLFW_KEY_KP_MULTIPLY:  return "KEYPAD MULTPLY";
        case GLFW_KEY_KP_SUBTRACT:  return "KEYPAD SUBTRACT";
        case GLFW_KEY_KP_ADD:       return "KEYPAD ADD";
        case GLFW_KEY_KP_DECIMAL:   return "KEYPAD DECIMAL";
        case GLFW_KEY_KP_EQUAL:     return "KEYPAD EQUAL";
        case GLFW_KEY_KP_ENTER:     return "KEYPAD ENTER";
        case GLFW_KEY_PRINT_SCREEN: return "PRINT SCREEN";
        case GLFW_KEY_NUM_LOCK:     return "NUM LOCK";
        case GLFW_KEY_CAPS_LOCK:    return "CAPS LOCK";
        case GLFW_KEY_SCROLL_LOCK:  return "SCROLL LOCK";
        case GLFW_KEY_PAUSE:        return "PAUSE";
        case GLFW_KEY_LEFT_SUPER:   return "LEFT SUPER";
        case GLFW_KEY_RIGHT_SUPER:  return "RIGHT SUPER";
        case GLFW_KEY_MENU:         return "MENU";

        default:                    return "UNKNOWN";
    }
}